

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O3

void print_gotos(int stateno)

{
  shifts *psVar1;
  int iVar2;
  Yshort *pYVar3;
  int iVar4;
  long lVar5;
  
  putc(10,(FILE *)verbose_file);
  psVar1 = shift_table[stateno];
  iVar2 = psVar1->nshifts;
  if (0 < iVar2) {
    lVar5 = 0;
    pYVar3 = accessing_symbol;
    iVar4 = start_symbol;
    do {
      if (iVar4 <= pYVar3[psVar1->shift[lVar5]]) {
        fprintf((FILE *)verbose_file,"\t%s  goto %d\n",symbol_name[pYVar3[psVar1->shift[lVar5]]]);
        iVar2 = psVar1->nshifts;
        pYVar3 = accessing_symbol;
        iVar4 = start_symbol;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  return;
}

Assistant:

void print_gotos(int stateno)
{
    register int i, k;
    register int as;
    register Yshort *to_state;
    register shifts *sp;

    putc('\n', verbose_file);
    sp = shift_table[stateno];
    to_state = sp->shift;
    for (i = 0; i < sp->nshifts; ++i)
    {
	k = to_state[i];
	as = accessing_symbol[k];
	if (ISVAR(as))
	    fprintf(verbose_file, "\t%s  goto %d\n", symbol_name[as], k);
    }
}